

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_conv_2d_dw_direct
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int stride0,int stride1,int pad0,int pad1
          ,int dilation0,int dilation1)

{
  size_t sVar1;
  _Bool _Var2;
  ggml_tensor *tensor;
  size_t sVar3;
  char *pcVar4;
  int line;
  int32_t params [6];
  int64_t ne [4];
  
  if (a->ne[2] == 1) {
    if (a->ne[3] == b->ne[2]) {
      ne[0] = (~((a->ne[0] + -1) * (long)dilation0) + (long)(pad0 * 2) + b->ne[0]) / (long)stride0 +
              1;
      ne[1] = (~((a->ne[1] + -1) * (long)dilation1) + (long)(pad1 * 2) + b->ne[1]) / (long)stride1 +
              1;
      ne[3] = b->ne[3];
      ne[2] = a->ne[3];
      tensor = ggml_new_tensor(ctx,b->type,4,ne);
      _Var2 = ggml_is_contiguous_channels(b);
      if (_Var2) {
        if ((0x5f000003UL >> ((ulong)tensor->type & 0x3f) & 1) == 0) {
          pcVar4 = "ggml_blck_size(result->type) == 1";
          line = 0xff7;
          goto LAB_001236f3;
        }
        sVar1 = type_traits[tensor->type].type_size;
        sVar3 = tensor->ne[2] * sVar1;
        tensor->nb[0] = sVar3;
        tensor->nb[1] = sVar3 * tensor->ne[0];
        tensor->nb[2] = sVar1;
      }
      params[3] = pad1;
      params[4] = dilation0;
      params[5] = dilation1;
      params[0] = stride0;
      params[1] = stride1;
      params[2] = pad0;
      ggml_set_op_params(tensor,params,0x18);
      tensor->op = GGML_OP_CONV_2D_DW;
      tensor->src[0] = a;
      tensor->src[1] = b;
      return tensor;
    }
    pcVar4 = "a->ne[3] == b->ne[2]";
    line = 0xfeb;
  }
  else {
    pcVar4 = "a->ne[2] == 1";
    line = 0xfea;
  }
LAB_001236f3:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

struct ggml_tensor * ggml_conv_2d_dw_direct(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   stride0,
        int                   stride1,
        int                   pad0,
        int                   pad1,
        int                   dilation0,
        int                   dilation1) {
    GGML_ASSERT(a->ne[2] == 1);
    GGML_ASSERT(a->ne[3] == b->ne[2]);
    int64_t ne[4];
    ne[0] = ggml_calc_conv_output_size(b->ne[0], a->ne[0], stride0, pad0, dilation0);
    ne[1] = ggml_calc_conv_output_size(b->ne[1], a->ne[1], stride1, pad1, dilation1);
    ne[2] = b->ne[2];
    ne[3] = b->ne[3];

    struct ggml_tensor * result = ggml_new_tensor(ctx, b->type, 4, ne);

    if (ggml_is_contiguous_channels(b)) {
        // Result will be permuted the same way as input (CWHN order)
        const int64_t type_size = ggml_type_size(result->type);
        GGML_ASSERT(ggml_blck_size(result->type) == 1);
        result->nb[0] = result->ne[2] * type_size;
        result->nb[1] = result->ne[0] * result->nb[0];
        result->nb[2] = type_size;
    }

    int32_t params[] = { stride0, stride1, pad0, pad1, dilation0, dilation1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CONV_2D_DW;
    result->src[0] = a;
    result->src[1] = b;
    return result;
}